

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnlabeledValueArg.h
# Opt level: O1

bool __thiscall
TCLAP::
UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::operator==(UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,Arg *a)

{
  size_t sVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  string local_48;
  
  sVar1 = (this->
          super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).super_Arg._name._M_string_length;
  if (sVar1 == (a->_name)._M_string_length) {
    if (sVar1 == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp((this->
                   super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).super_Arg._name._M_dataplus._M_p,(a->_name)._M_dataplus._M_p,sVar1);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  bVar4 = true;
  if (!bVar3) {
    Arg::getDescription_abi_cxx11_(&local_48,a);
    sVar1 = (this->
            super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).super_Arg._description._M_string_length;
    if (sVar1 == local_48._M_string_length) {
      if (sVar1 != 0) {
        iVar2 = bcmp((this->
                     super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ).super_Arg._description._M_dataplus._M_p,local_48._M_dataplus._M_p,sVar1);
        bVar4 = iVar2 == 0;
      }
    }
    else {
      bVar4 = false;
    }
  }
  if ((!bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2)) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return bVar4;
}

Assistant:

bool UnlabeledValueArg<T>::operator==(const Arg& a ) const
{
	if ( _name == a.getName() || _description == a.getDescription() )
		return true;
	else
		return false;
}